

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O0

CameraSample *
pbrt::GetCameraSample<pbrt::SamplerHandle>
          (SamplerHandle *sampler,Point2i *pPixel,FilterHandle *filter)

{
  Tuple2<pbrt::Point2,_float> TVar1;
  BasicOptions *pBVar2;
  CameraSample *in_RDI;
  Float FVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  FilterSample FVar10;
  FilterSample fs;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  CameraSample *in_stack_ffffffffffffff70;
  SamplerHandle *this;
  Point2f *in_stack_ffffffffffffff98;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  in_stack_ffffffffffffffa0;
  Float local_1c;
  undefined1 extraout_var [56];
  undefined1 auVar9 [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  auVar4._0_8_ = SamplerHandle::Get2D
                           ((SamplerHandle *)
                            CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  auVar4._8_56_ = extraout_var;
  vmovlpd_avx(auVar4._0_16_);
  auVar9 = extraout_var;
  FVar10 = FilterHandle::Sample
                     ((FilterHandle *)in_stack_ffffffffffffffa0.bits,in_stack_ffffffffffffff98);
  local_1c = FVar10.weight;
  auVar5._0_8_ = FVar10.p.super_Tuple2<pbrt::Point2,_float>;
  auVar5._8_56_ = auVar9;
  vmovlpd_avx(auVar5._0_16_);
  pBVar2 = GetOptions();
  if ((pBVar2->disablePixelJitter & 1U) != 0) {
    Point2<float>::Point2
              (&in_stack_ffffffffffffff70->pFilm,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68
              );
    local_1c = 1.0;
  }
  CameraSample::CameraSample(in_stack_ffffffffffffff70);
  auVar6._0_8_ = Tuple2<pbrt::Point2,int>::operator+
                           ((Tuple2<pbrt::Point2,_int> *)
                            CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                            (Point2<float> *)0x7cd3b4);
  auVar6._8_56_ = extraout_var_00;
  vmovlpd_avx(auVar6._0_16_);
  this = (SamplerHandle *)&stack0xffffffffffffffa0;
  Vector2<float>::Vector2
            ((Vector2<float> *)this,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  auVar7._0_8_ = Point2<float>::operator+
                           ((Point2<float> *)
                            CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                            (Vector2<float> *)0x7cd3e4);
  auVar7._8_56_ = extraout_var_01;
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar7._0_16_);
  (in_RDI->pFilm).super_Tuple2<pbrt::Point2,_float> = TVar1;
  FVar3 = SamplerHandle::Get1D(this);
  in_RDI->time = FVar3;
  auVar8._0_8_ = SamplerHandle::Get2D
                           ((SamplerHandle *)
                            CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  auVar8._8_56_ = extraout_var_02;
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar8._0_16_);
  (in_RDI->pLens).super_Tuple2<pbrt::Point2,_float> = TVar1;
  in_RDI->weight = local_1c;
  return in_RDI;
}

Assistant:

inline PBRT_CPU_GPU CameraSample GetCameraSample(Sampler sampler, const Point2i &pPixel,
                                                 FilterHandle filter) {
    FilterSample fs = filter.Sample(sampler.Get2D());
    if (GetOptions().disablePixelJitter) {
        fs.p = Point2f(0, 0);
        fs.weight = 1;
    }

    CameraSample cs;
    cs.pFilm = pPixel + fs.p + Vector2f(0.5, 0.5);
    cs.time = sampler.Get1D();
    cs.pLens = sampler.Get2D();
    cs.weight = fs.weight;
    return cs;
}